

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O1

web_seed_t * __thiscall
libtorrent::aux::torrent::add_web_seed
          (torrent *this,string *url,string *auth,headers_t *extra_headers,web_seed_flag_t flags)

{
  list<libtorrent::aux::web_seed_t,_std::allocator<libtorrent::aux::web_seed_t>_> *this_00;
  size_t *psVar1;
  byte bVar2;
  _List_node_base *p_Var3;
  _List_node_base *__n;
  bool in;
  int iVar4;
  _Node *p_Var5;
  web_seed_t *pwVar6;
  web_seed_t ent;
  web_seed_t local_138;
  
  web_seed_t::web_seed_t(&local_138,url,auth,extra_headers);
  local_138.no_local_ips = (bool)(flags.m_val >> 1 & 1);
  this_00 = &this->m_web_seeds;
  p_Var3 = (this->m_web_seeds).
           super__List_base<libtorrent::aux::web_seed_t,_std::allocator<libtorrent::aux::web_seed_t>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  local_138.ephemeral = (bool)(flags.m_val & 1);
  while ((p_Var3 != (_List_node_base *)this_00 &&
         ((__n = p_Var3[1]._M_prev,
          __n != (_List_node_base *)local_138.super_web_seed_entry.url._M_string_length ||
          ((__n != (_List_node_base *)0x0 &&
           (iVar4 = bcmp(p_Var3[1]._M_next,local_138.super_web_seed_entry.url._M_dataplus._M_p,
                         (size_t)__n), iVar4 != 0))))))) {
    p_Var3 = p_Var3->_M_next;
  }
  if (p_Var3 == (_List_node_base *)this_00) {
    p_Var5 = ::std::__cxx11::
             list<libtorrent::aux::web_seed_t,_std::allocator<libtorrent::aux::web_seed_t>_>::
             _M_create_node<libtorrent::aux::web_seed_t>(this_00,&local_138);
    ::std::__detail::_List_node_base::_M_hook(&p_Var5->super__List_node_base);
    psVar1 = &(this->m_web_seeds).
              super__List_base<libtorrent::aux::web_seed_t,_std::allocator<libtorrent::aux::web_seed_t>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
    if ((local_138.ephemeral == false) &&
       (bVar2 = (this->m_need_save_resume_data).m_val, -1 < (char)bVar2)) {
      (this->m_need_save_resume_data).m_val = bVar2 | 0x80;
      state_updated(this);
    }
    in = want_tick(this);
    update_list(this,(torrent_list_index_t)0x1,in);
    pwVar6 = (web_seed_t *)
             ((this->m_web_seeds).
              super__List_base<libtorrent::aux::web_seed_t,_std::allocator<libtorrent::aux::web_seed_t>_>
              ._M_impl._M_node.super__List_node_base._M_prev + 1);
  }
  else {
    pwVar6 = (web_seed_t *)(p_Var3 + 1);
    if (((flags.m_val & 1) == 0 & *(undefined1 *)((long)&p_Var3[0xb]._M_next + 4)) == 1) {
      bVar2 = (this->m_need_save_resume_data).m_val;
      if (-1 < (char)bVar2) {
        (this->m_need_save_resume_data).m_val = bVar2 | 0x80;
        state_updated(this);
      }
      *(undefined1 *)((long)&p_Var3[0xb]._M_next + 4) = 0;
    }
  }
  web_seed_t::~web_seed_t(&local_138);
  return pwVar6;
}

Assistant:

web_seed_t* torrent::add_web_seed(std::string const& url
		, std::string const& auth
		, web_seed_entry::headers_t const& extra_headers
		, web_seed_flag_t const flags)
	{
		web_seed_t ent(url, auth, extra_headers);
		ent.ephemeral = bool(flags & ephemeral);
		ent.no_local_ips = bool(flags & no_local_ips);

		// don't add duplicates
		auto const it = std::find(m_web_seeds.begin(), m_web_seeds.end(), ent);
		if (it != m_web_seeds.end())
		{
			// if we're adding a web seed (as non-ephemeral) and we have an
			// ephemeral web seed already, promote it to non-ephemeral
			if (it->ephemeral && !ent.ephemeral)
			{
				set_need_save_resume(torrent_handle::if_metadata_changed);
				it->ephemeral = false;
			}
			return &*it;
		}
		m_web_seeds.emplace_back(std::move(ent));

		// ephemeral web seeds are not saved in the resume data
		if (!ent.ephemeral)
			set_need_save_resume(torrent_handle::if_metadata_changed);

		update_want_tick();
		return &m_web_seeds.back();
	}